

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

void Hex2RGB(char *aHexRGB,uchar *aoResultRGB)

{
  char in_RAX [8];
  ulong uVar1;
  char lColorChannel [8];
  
  if (aoResultRGB != (uchar *)0x0) {
    if (aHexRGB == (char *)0x0) {
      aoResultRGB[0] = '\0';
      aoResultRGB[1] = '\0';
      aoResultRGB[2] = '\0';
    }
    else {
      lColorChannel = in_RAX;
      strcpy(lColorChannel,aHexRGB);
      uVar1 = strtoul(lColorChannel + 5,(char **)0x0,0x10);
      aoResultRGB[2] = (uchar)uVar1;
      lColorChannel[5] = '\0';
      uVar1 = strtoul(lColorChannel + 3,(char **)0x0,0x10);
      aoResultRGB[1] = (uchar)uVar1;
      lColorChannel[3] = '\0';
      uVar1 = strtoul(lColorChannel + 1,(char **)0x0,0x10);
      *aoResultRGB = (uchar)uVar1;
    }
  }
  return;
}

Assistant:

static void Hex2RGB( char const aHexRGB[8] , unsigned char aoResultRGB[3] )
{
        char lColorChannel[8] ;
        if ( aoResultRGB )
        {
                if ( aHexRGB )
                {
                        strcpy(lColorChannel, aHexRGB ) ;
                        aoResultRGB[2] = (unsigned char)strtoul(lColorChannel+5,NULL,16);
                        lColorChannel[5] = '\0';
                        aoResultRGB[1] = (unsigned char)strtoul(lColorChannel+3,NULL,16);
                        lColorChannel[3] = '\0';
                        aoResultRGB[0] = (unsigned char)strtoul(lColorChannel+1,NULL,16);
/* printf("%d %d %d\n", aoResultRGB[0], aoResultRGB[1], aoResultRGB[2]); */
                }
                else
                {
                        aoResultRGB[0]=0;
                        aoResultRGB[1]=0;
                        aoResultRGB[2]=0;
                }
        }
}